

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O1

bool __thiscall Assembler::isDirective(Assembler *this,string *line)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  pcVar1 = (line->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + line->_M_string_length);
  bVar7 = checkIfSection(this,&local_b0);
  bVar9 = true;
  if (!bVar7) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar1 = (line->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + line->_M_string_length);
    bVar8 = checkIfEnd(this,&local_50);
    if (!bVar8) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      pcVar1 = (line->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + line->_M_string_length);
      bVar9 = checkIfEqu(this,&local_70);
      if (bVar9) {
        bVar5 = false;
LAB_0010bf26:
        bVar4 = false;
LAB_0010bf29:
        bVar3 = false;
LAB_0010bf2b:
        bVar2 = false;
      }
      else {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        pcVar1 = (line->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar1,pcVar1 + line->_M_string_length);
        bVar9 = checkIfExtern(this,&local_90);
        if (bVar9) {
          bVar5 = true;
          goto LAB_0010bf26;
        }
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        pcVar1 = (line->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,pcVar1,pcVar1 + line->_M_string_length);
        bVar9 = checkIfGlobal(this,&local_d0);
        if (bVar9) {
          bVar5 = true;
          bVar4 = true;
          goto LAB_0010bf29;
        }
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        pcVar1 = (line->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,pcVar1,pcVar1 + line->_M_string_length);
        bVar9 = checkIfSkip(this,&local_f0);
        if (bVar9) {
          bVar5 = true;
          bVar4 = true;
          bVar3 = true;
          goto LAB_0010bf2b;
        }
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        pcVar1 = (line->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,pcVar1,pcVar1 + line->_M_string_length);
        bVar9 = checkIfWord(this,&local_110);
        if (!bVar9) {
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          pcVar1 = (line->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_130,pcVar1,pcVar1 + line->_M_string_length);
          bVar9 = checkIfLabel(this,&local_130);
          bVar6 = true;
          bVar5 = true;
          bVar4 = true;
          bVar3 = true;
          bVar2 = true;
          bVar8 = true;
          goto LAB_0010bf30;
        }
        bVar5 = true;
        bVar4 = true;
        bVar3 = true;
        bVar2 = true;
      }
      bVar8 = false;
      bVar6 = true;
      bVar9 = true;
      goto LAB_0010bf30;
    }
  }
  bVar6 = false;
  bVar5 = false;
  bVar4 = false;
  bVar3 = false;
  bVar2 = false;
  bVar8 = false;
LAB_0010bf30:
  if ((bVar8) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2)) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((bVar2) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2)) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((bVar3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2)) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((bVar4) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2)) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((bVar5) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2)) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((bVar6) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((!bVar7) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return bVar9;
}

Assistant:

bool Assembler::isDirective(string line) {
    if (checkIfSection(line) || checkIfEnd(line) || checkIfEqu(line) || checkIfExtern(line)
        || checkIfGlobal(line) || checkIfSkip(line) || checkIfWord(line)
        || checkIfLabel(line))
        return true;
    else return false;
}